

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

int __thiscall
QTzTimeZonePrivate::daylightTimeOffset(QTzTimeZonePrivate *this,qint64 atMSecsSinceEpoch)

{
  long in_FS_OFFSET;
  Data local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  data(&local_48,this,atMSecsSinceEpoch);
  if (&(local_48.abbreviation.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.abbreviation.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.abbreviation.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_48.abbreviation.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_48.abbreviation.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_48.daylightTimeOffset;
  }
  __stack_chk_fail();
}

Assistant:

int QTzTimeZonePrivate::daylightTimeOffset(qint64 atMSecsSinceEpoch) const
{
    return data(atMSecsSinceEpoch).daylightTimeOffset;
}